

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgknm(char *card,char *name,int *length,int *status)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  *name = '\0';
  *length = 0;
  if ((*card == 'H') && (iVar2 = strncmp(card,"HIERARCH ",9), iVar2 == 0)) {
    pcVar3 = strchr(card,0x3d);
    if (pcVar3 == (char *)0x0) {
      sVar5 = strlen(name);
      builtin_strncpy(name + sVar5,"HIERARCH",9);
      iVar2 = 8;
      goto LAB_00166db6;
    }
    lVar6 = 0;
    do {
      lVar7 = lVar6;
      lVar6 = lVar7 + 1;
    } while (card[lVar7 + 9] == ' ');
    strncat(name,card + lVar7 + 9,(size_t)(pcVar3 + (-lVar6 - (long)card) + -8));
    uVar4 = (ulong)((((int)pcVar3 - (int)card) - (int)lVar6) + -8);
    while ((iVar2 = (int)uVar4, 0 < iVar2 && (name[(uVar4 & 0xffffffff) - 1] == ' '))) {
      uVar4 = uVar4 - 1;
    }
  }
  else {
    iVar2 = 0x4a;
    uVar4 = 0x4a;
    for (lVar6 = 0; lVar6 != 0x4a; lVar6 = lVar6 + 1) {
      bVar1 = card[lVar6];
      if (((ulong)bVar1 < 0x3e) && ((0x2000000100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        name[lVar6] = '\0';
        iVar2 = (int)lVar6;
        goto LAB_00166db6;
      }
      name[lVar6] = bVar1;
    }
  }
  name[uVar4] = '\0';
LAB_00166db6:
  *length = iVar2;
  return *status;
}

Assistant:

int ffgknm( char *card,         /* I - keyword card                   */
            char *name,         /* O - name of the keyword            */
            int *length,        /* O - length of the keyword name     */
            int  *status)       /* IO - error status                  */

/*
  Return the name of the keyword, and the name length.  This supports the
  ESO HIERARCH convention where keyword names may be > 8 characters long.
*/
{
    char *ptr1, *ptr2;
    int ii, namelength;

    namelength = FLEN_KEYWORD - 1;
    *name = '\0';
    *length = 0;

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
        ptr2 = strchr(card, '=');

        if (!ptr2)   /* no value indicator ??? */
        {
            /* this probably indicates an error, so just return FITS name */
            strcat(name, "HIERARCH");
            *length = 8;
            return(*status);
        }

        /* find the start and end of the HIERARCH name */
        ptr1 = &card[9];
        while (*ptr1 == ' ')   /* skip spaces */
            ptr1++;

        strncat(name, ptr1, ptr2 - ptr1);
        ii = ptr2 - ptr1;

        while (ii > 0 && name[ii - 1] == ' ')  /* remove trailing spaces */
            ii--;

        name[ii] = '\0';
        *length = ii;
    }
    else
    {
        for (ii = 0; ii < namelength; ii++)
        {
           /* look for string terminator, or a blank */
           if (*(card+ii) != ' ' && *(card+ii) != '=' && *(card+ii) !='\0')
           {
               *(name+ii) = *(card+ii);
           }
           else
           {
               name[ii] = '\0';
               *length = ii;
               return(*status);
           }
        }

        /* if we got here, keyword is namelength characters long */
        name[namelength] = '\0';
        *length = namelength;
    }

    return(*status);
}